

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.cpp
# Opt level: O0

void __thiscall solveEq_ax2_bx_c_Test::TestBody(solveEq_ax2_bx_c_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr EVar2;
  AssertHelper local_120;
  Message local_118;
  ExprPtr local_110;
  ExprPtr local_100;
  ExprPtr local_f0;
  ExprPtr local_e0 [2];
  ExprPtr local_c0;
  ExprPtr local_b0;
  ExprPtr local_a0;
  ExprPtr local_90;
  ExprPtr local_80;
  ExprPtr local_70;
  shared_ptr<const_mathiu::impl::Expr> local_60;
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ExprPtr x;
  solveEq_ax2_bx_c_Test *this_local;
  
  mathiu::impl::operator____s((impl *)&gtest_ar.message_,"x",1);
  mathiu::impl::operator____i((impl *)&local_c0,2);
  mathiu::impl::operator*((impl *)&local_b0,&local_c0,(ExprPtr *)&gtest_ar.message_);
  mathiu::impl::operator*((impl *)&local_a0,&local_b0,(ExprPtr *)&gtest_ar.message_);
  mathiu::impl::operator____i((impl *)&local_f0,3);
  mathiu::impl::operator*((impl *)local_e0,&local_f0,(ExprPtr *)&gtest_ar.message_);
  mathiu::impl::operator-((impl *)&local_90,&local_a0,local_e0);
  mathiu::impl::operator____i((impl *)&local_100,1);
  mathiu::impl::operator+((impl *)&local_80,&local_90,&local_100);
  mathiu::impl::operator____i((impl *)&local_110,0);
  mathiu::impl::operator==((impl *)&local_70,&local_80,&local_110);
  EVar2 = mathiu::impl::solve((impl *)&local_60,&local_70,(ExprPtr *)&gtest_ar.message_,
                              (ExprPtr *)mathiu::impl::true_);
  mathiu::impl::toString_abi_cxx11_
            (&local_50,(impl *)&local_60,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_30,"toString(solve(2_i * x * x - 3_i * x + 1_i == 0_i, x))",
             "\"{1/2 1}\"",&local_50,(char (*) [8])"{1/2 1}");
  std::__cxx11::string::~string((string *)&local_50);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_60);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_70);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_110);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_80);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_100);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_90);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(local_e0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_f0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_a0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_b0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/solve.cpp"
               ,0x51,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(solveEq, ax2_bx_c)
{
    auto const x = "x"_s;
    EXPECT_EQ(toString(solve(2_i * x * x - 3_i * x + 1_i == 0_i, x)), "{1/2 1}");
}